

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O1

size_t mpack_node_enum_optional(mpack_node_t node,char **strings,size_t count)

{
  char *__s;
  bool bVar1;
  int iVar2;
  size_t in_RAX;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  mpack_tree_t *pmVar6;
  mpack_node_data_t *pmVar7;
  size_t __n;
  char *__s1;
  size_t local_38;
  
  pmVar6 = node.tree;
  pmVar7 = node.data;
  if (pmVar6->error != mpack_ok) {
    return count;
  }
  if (pmVar7->type != mpack_type_str) {
    return count;
  }
  if (pmVar7->type == mpack_type_str) {
    __s1 = pmVar6->data + (long)(pmVar7->value).children;
  }
  else {
    pmVar6->error = mpack_error_type;
    if (pmVar6->error_fn != (mpack_tree_error_t)0x0) {
      (*pmVar6->error_fn)(pmVar6,mpack_error_type);
    }
    __s1 = (char *)0x0;
  }
  if (pmVar6->error == mpack_ok) {
    if (pmVar7->type == mpack_type_str) {
      __n = (size_t)pmVar7->len;
      goto LAB_0010a63e;
    }
    pmVar6->error = mpack_error_type;
    if (pmVar6->error_fn != (mpack_tree_error_t)0x0) {
      (*pmVar6->error_fn)(pmVar6,mpack_error_type);
    }
  }
  __n = 0;
LAB_0010a63e:
  sVar4 = count;
  if (count != 0) {
    sVar5 = 0;
    local_38 = in_RAX;
    do {
      __s = strings[sVar5];
      sVar3 = strlen(__s);
      if ((__n == sVar3) && (iVar2 = bcmp(__s1,__s,__n), iVar2 == 0)) {
        bVar1 = false;
        local_38 = sVar5;
      }
      else {
        bVar1 = true;
      }
      sVar4 = local_38;
    } while ((bVar1) && (sVar5 = sVar5 + 1, sVar4 = count, count != sVar5));
  }
  return sVar4;
}

Assistant:

size_t mpack_node_enum_optional(mpack_node_t node, const char* strings[], size_t count) {
    if (mpack_node_error(node) != mpack_ok)
        return count;

    // the value is only recognized if it is a string
    if (mpack_node_type(node) != mpack_type_str)
        return count;

    // fetch the string
    const char* key = mpack_node_str(node);
    size_t keylen = mpack_node_strlen(node);
    mpack_assert(mpack_node_error(node) == mpack_ok, "these should not fail");

    // find what key it matches
    for (size_t i = 0; i < count; ++i) {
        const char* other = strings[i];
        size_t otherlen = mpack_strlen(other);
        if (keylen == otherlen && mpack_memcmp(key, other, keylen) == 0)
            return i;
    }

    // no matches
    return count;
}